

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

UNormalizationCheckResult __thiscall
icu_63::ComposeNormalizer2::quickCheck
          (ComposeNormalizer2 *this,UnicodeString *s,UErrorCode *errorCode)

{
  Normalizer2Impl *this_00;
  UBool UVar1;
  int32_t iVar2;
  char16_t *src;
  UNormalizationCheckResult local_34;
  char16_t *pcStack_30;
  UNormalizationCheckResult qcResult;
  UChar *sArray;
  UErrorCode *errorCode_local;
  UnicodeString *s_local;
  ComposeNormalizer2 *this_local;
  
  sArray = (UChar *)errorCode;
  errorCode_local = (UErrorCode *)s;
  s_local = (UnicodeString *)this;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    src = UnicodeString::getBuffer((UnicodeString *)errorCode_local);
    if (src == (char16_t *)0x0) {
      sArray[0] = L'\x01';
      sArray[1] = L'\0';
      this_local._4_4_ = UNORM_MAYBE;
    }
    else {
      local_34 = UNORM_YES;
      this_00 = (this->super_Normalizer2WithImpl).impl;
      pcStack_30 = src;
      iVar2 = UnicodeString::length((UnicodeString *)errorCode_local);
      Normalizer2Impl::composeQuickCheck(this_00,src,src + iVar2,this->onlyContiguous,&local_34);
      this_local._4_4_ = local_34;
    }
  }
  else {
    this_local._4_4_ = UNORM_MAYBE;
  }
  return this_local._4_4_;
}

Assistant:

virtual UNormalizationCheckResult
    quickCheck(const UnicodeString &s, UErrorCode &errorCode) const U_OVERRIDE {
        if(U_FAILURE(errorCode)) {
            return UNORM_MAYBE;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return UNORM_MAYBE;
        }
        UNormalizationCheckResult qcResult=UNORM_YES;
        impl.composeQuickCheck(sArray, sArray+s.length(), onlyContiguous, &qcResult);
        return qcResult;
    }